

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::render
          (FragmentProcessor *this,MultisamplePixelBufferAccess *msColorBuffer,
          MultisamplePixelBufferAccess *msDepthBuffer,MultisamplePixelBufferAccess *msStencilBuffer,
          Fragment *inputFragments,int numFragments,FaceType fragmentFacing,
          FragmentOperationState *state)

{
  BVec4 *colorMask;
  bool bVar1;
  bool bVar2;
  int numSamplesPerFragment;
  undefined4 uVar3;
  bool bVar4;
  ulong uVar5;
  undefined8 uVar6;
  Vec4 VVar7;
  bool isSRGB;
  byte bVar8;
  byte bVar9;
  TextureChannelClass TVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  StencilState *stencilState;
  SampleData *pSVar16;
  float *pfVar17;
  int fragNdxOffset;
  int regSampleNdx_3;
  int iVar18;
  Vec3 *a;
  bool bVar19;
  char cVar20;
  undefined8 uVar21;
  undefined1 uVar29;
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Vector<float,_4> local_168;
  MultisamplePixelBufferAccess *local_158;
  int local_14c;
  Vec4 dstColor;
  Vec4 dstColor_1;
  Vec4 minClampValue;
  Vec4 maxClampValue;
  Vec4 local_68;
  Vec4 local_58;
  tcu local_40 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined2 uVar30;
  
  bVar19 = false;
  if ((0 < (msDepthBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[0]) &&
     (0 < (msDepthBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[1])) {
    bVar19 = 0 < (msDepthBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[2];
  }
  bVar4 = false;
  if ((0 < (msStencilBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[0]) &&
     (0 < (msStencilBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[1])) {
    bVar4 = 0 < (msStencilBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[2];
  }
  bVar1 = state->stencilTestEnabled;
  bVar2 = state->depthTestEnabled;
  TVar10 = tcu::getTextureChannelClass
                     ((msColorBuffer->m_access).super_ConstPixelBufferAccess.m_format.type);
  cVar20 = TVar10 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
  if (TVar10 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    cVar20 = '\x02';
  }
  numSamplesPerFragment = (msColorBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[0];
  iVar18 = (numSamplesPerFragment * numFragments + -1) / 0x40;
  uVar3 = *(undefined4 *)(state->colorMask).m_data;
  uVar29 = (undefined1)((uint)uVar3 >> 0x18);
  uVar30 = CONCAT11(uVar29,uVar29);
  uVar29 = (undefined1)((uint)uVar3 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar30,uVar29),CONCAT14(uVar29,uVar3));
  uVar29 = (undefined1)((uint)uVar3 >> 8);
  uVar6 = CONCAT53(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar29),CONCAT12(uVar29,(short)uVar3));
  uVar15 = CONCAT62((int6)((ulong)uVar6 >> 0x10),(short)uVar3) & 0xffffffffffff00ff;
  auVar24._8_4_ = 0;
  auVar24._0_8_ = uVar15;
  auVar24._12_2_ = uVar30;
  auVar24._14_2_ = uVar30;
  uVar30 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar23._12_4_ = auVar24._12_4_;
  auVar23._8_2_ = 0;
  auVar23._0_8_ = uVar15;
  auVar23._10_2_ = uVar30;
  auVar22._10_6_ = auVar23._10_6_;
  auVar22._8_2_ = uVar30;
  auVar22._0_8_ = uVar15;
  uVar30 = (undefined2)((ulong)uVar6 >> 0x10);
  auVar27._8_8_ = auVar22._8_8_;
  auVar27._6_2_ = uVar30;
  auVar27._0_4_ = (int)uVar15;
  auVar27._4_2_ = uVar30;
  auVar25._0_4_ = (auVar27._0_4_ << 0x1f) >> 0x1f;
  auVar25._4_4_ = (auVar27._4_4_ << 0x1f) >> 0x1f;
  auVar25._8_4_ = (auVar22._8_4_ << 0x1f) >> 0x1f;
  auVar25._12_4_ = (auVar23._12_4_ << 0x1f) >> 0x1f;
  local_58.m_data = (float  [4])(auVar25 & _DAT_0094bfa0);
  local_68.m_data = (float  [4])(~auVar25 & _DAT_0094bfa0);
  isSRGB = false;
  local_158 = msColorBuffer;
  local_14c = numFragments;
  if (state->sRGBEnabled == true) {
    isSRGB = tcu::isSRGB((msColorBuffer->m_access).super_ConstPixelBufferAccess.m_format);
  }
  iVar14 = 0;
  bVar8 = bVar19 & bVar2;
  bVar9 = bVar4 & bVar1;
  stencilState = state->stencilStates + fragmentFacing;
  colorMask = &state->colorMask;
  iVar11 = -1;
  if (-1 < iVar18) {
    iVar11 = iVar18;
  }
  iVar18 = local_14c;
  do {
    if (iVar14 == iVar11 + 1) {
      return;
    }
    fragNdxOffset = (iVar14 << 6) / numSamplesPerFragment;
    uVar15 = 0;
    pSVar16 = this->m_sampleRegister;
    for (; uVar15 != 0x40; uVar15 = uVar15 + 1) {
      uVar5 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
      iVar12 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
      if (iVar12 < iVar18) {
        ((SampleData *)&pSVar16->isAlive)->isAlive =
             (inputFragments[iVar12].coverage >>
              ((uint)((long)uVar5 % (long)numSamplesPerFragment) & 0x1f) & 1) != 0;
        pSVar16->depthPassed = true;
      }
      else {
        ((SampleData *)&pSVar16->isAlive)->isAlive = false;
      }
      pSVar16 = pSVar16 + 1;
    }
    if (state->scissorTestEnabled != false) {
      executeScissorTest(this,fragNdxOffset,numSamplesPerFragment,inputFragments,
                         &state->scissorRectangle);
    }
    if (bVar9 != 0) {
      executeStencilCompare
                (this,fragNdxOffset,numSamplesPerFragment,inputFragments,stencilState,
                 state->numStencilBits,(ConstPixelBufferAccess *)msStencilBuffer);
      executeStencilSFail(this,fragNdxOffset,numSamplesPerFragment,inputFragments,stencilState,
                          state->numStencilBits,&msStencilBuffer->m_access);
    }
    if (bVar8 != 0) {
      executeDepthCompare(this,fragNdxOffset,numSamplesPerFragment,inputFragments,state->depthFunc,
                          (ConstPixelBufferAccess *)msDepthBuffer);
      if (state->depthMask == true) {
        executeDepthWrite(this,fragNdxOffset,numSamplesPerFragment,inputFragments,
                          &msDepthBuffer->m_access);
      }
    }
    if (bVar9 != 0) {
      executeStencilDpFailAndPass
                (this,fragNdxOffset,numSamplesPerFragment,inputFragments,stencilState,
                 state->numStencilBits,&msStencilBuffer->m_access);
    }
    if (bVar8 != 0) {
      for (lVar13 = 0; lVar13 != 0x2100; lVar13 = lVar13 + 0x84) {
        if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar13 + -4) ==
            '\x01') {
          uVar29 = *(undefined1 *)
                    ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar13 + -2);
        }
        else {
          uVar29 = 0;
        }
        *(undefined1 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar13 + -4) =
             uVar29;
      }
    }
    if (cVar20 == '\0') {
      tcu::Vector<float,_4>::Vector(&minClampValue);
      tcu::Vector<float,_4>::Vector(&maxClampValue);
      if (TVar10 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
        fVar32 = -1.0;
LAB_00532aeb:
        tcu::Vector<float,_4>::Vector(&dstColor_1,fVar32);
        minClampValue.m_data[3] = dstColor_1.m_data[3];
        minClampValue.m_data[2] = dstColor_1.m_data[2];
        fVar32 = 1.0;
      }
      else {
        if (TVar10 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
          fVar32 = 0.0;
          goto LAB_00532aeb;
        }
        tcu::Vector<float,_4>::Vector(&dstColor_1,-INFINITY);
        minClampValue.m_data[3] = dstColor_1.m_data[3];
        minClampValue.m_data[2] = dstColor_1.m_data[2];
        fVar32 = INFINITY;
      }
      minClampValue.m_data._0_8_ = dstColor_1.m_data._0_8_;
      tcu::Vector<float,_4>::Vector(&dstColor_1,fVar32);
      maxClampValue.m_data[2] = dstColor_1.m_data[2];
      maxClampValue.m_data[0] = dstColor_1.m_data[0];
      maxClampValue.m_data[1] = dstColor_1.m_data[1];
      maxClampValue.m_data[3] = dstColor_1.m_data[3];
      if (state->blendMode == BLENDMODE_STANDARD) {
        uVar15 = 0;
        pSVar16 = this->m_sampleRegister;
        while( true ) {
          if (uVar15 == 0x40) break;
          if (((SampleData *)&pSVar16->isAlive)->isAlive == true) {
            uVar5 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
            iVar18 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&dstColor_1,(int)local_158,
                       (int)((long)uVar5 % (long)numSamplesPerFragment),
                       inputFragments[iVar18].pixelCoord.m_data[0]);
            local_168.m_data._0_8_ = *(undefined8 *)&inputFragments[iVar18].value.v;
            local_168.m_data._8_8_ = *(undefined8 *)((long)&inputFragments[iVar18].value.v + 8);
            tcu::clamp<float,4>((tcu *)&dstColor,&local_168,&minClampValue,&maxClampValue);
            *(undefined8 *)(pSVar16->clampedBlendSrcColor).m_data = dstColor.m_data._0_8_;
            *(undefined8 *)((pSVar16->clampedBlendSrcColor).m_data + 2) = dstColor.m_data._8_8_;
            local_168.m_data._0_8_ = *(undefined8 *)&inputFragments[iVar18].value1.v;
            local_168.m_data._8_8_ = *(undefined8 *)((long)&inputFragments[iVar18].value1.v + 8);
            tcu::clamp<float,4>((tcu *)&dstColor,&local_168,&minClampValue,&maxClampValue);
            *(undefined8 *)(pSVar16->clampedBlendSrc1Color).m_data = dstColor.m_data._0_8_;
            *(undefined8 *)((pSVar16->clampedBlendSrc1Color).m_data + 2) = dstColor.m_data._8_8_;
            if (isSRGB == false) {
              tcu::Vector<float,_4>::Vector(&local_168,(Vector<float,_4> *)&dstColor_1);
            }
            else {
              tcu::sRGBToLinear((tcu *)&local_168,&dstColor_1);
            }
            tcu::clamp<float,4>((tcu *)&dstColor,&local_168,&minClampValue,&maxClampValue);
            *(undefined8 *)(pSVar16->clampedBlendDstColor).m_data = dstColor.m_data._0_8_;
            *(undefined8 *)((pSVar16->clampedBlendDstColor).m_data + 2) = dstColor.m_data._8_8_;
          }
          uVar15 = uVar15 + 1;
          pSVar16 = pSVar16 + 1;
        }
        executeBlendFactorComputeRGB(this,&state->blendColor,&state->blendRGBState);
        executeBlendFactorComputeA(this,&state->blendColor,&state->blendAState);
        executeBlend(this,&state->blendRGBState,&state->blendAState);
      }
      else if (state->blendMode == BLENDMODE_ADVANCED) {
        pfVar17 = this->m_sampleRegister[0].clampedBlendDstColor.m_data + 3;
        for (uVar15 = 0; uVar15 != 0x40; uVar15 = uVar15 + 1) {
          if (*(char *)(pfVar17 + -0xc) == '\x01') {
            uVar5 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
            iVar18 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
            dstColor_1.m_data._0_8_ = *(undefined8 *)&inputFragments[iVar18].value.v;
            uVar21 = *(undefined8 *)((long)&inputFragments[iVar18].value.v + 8);
            dstColor_1.m_data[2] = (float)uVar21;
            dstColor_1.m_data[3] = (float)((ulong)uVar21 >> 0x20);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&dstColor,(int)local_158,
                       (int)((long)uVar5 % (long)numSamplesPerFragment),
                       inputFragments[iVar18].pixelCoord.m_data[0]);
            tcu::clamp<float,4>((tcu *)&local_168,&dstColor_1,&minClampValue,&maxClampValue);
            uVar21 = 0;
            fVar31 = 0.0;
            fVar32 = 0.0;
            if (0.0 < local_168.m_data[3]) {
              auVar26._8_8_ = 0;
              auVar26._0_4_ = local_168.m_data[0];
              auVar26._4_4_ = local_168.m_data[1];
              auVar33._4_4_ = local_168.m_data[3];
              auVar33._0_4_ = local_168.m_data[3];
              auVar33._8_4_ = local_168.m_data[3];
              auVar33._12_4_ = local_168.m_data[3];
              auVar27 = divps(auVar26,auVar33);
              uVar21 = auVar27._0_8_;
              fVar31 = local_168.m_data[2] / local_168.m_data[3];
              fVar32 = local_168.m_data[3];
            }
            *(undefined8 *)(pfVar17 + -0xb) = uVar21;
            pfVar17[-9] = fVar31;
            pfVar17[-8] = fVar32;
            if (isSRGB == false) {
              tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_40,&dstColor);
            }
            else {
              tcu::sRGBToLinear(local_40,&dstColor);
            }
            tcu::clamp<float,4>((tcu *)&local_168,(Vector<float,_4> *)local_40,&minClampValue,
                                &maxClampValue);
            uVar21 = 0;
            fVar32 = 0.0;
            fVar31 = 0.0;
            if (0.0 < local_168.m_data[3]) {
              auVar28._8_8_ = 0;
              auVar28._0_4_ = local_168.m_data[0];
              auVar28._4_4_ = local_168.m_data[1];
              auVar34._4_4_ = local_168.m_data[3];
              auVar34._0_4_ = local_168.m_data[3];
              auVar34._8_4_ = local_168.m_data[3];
              auVar34._12_4_ = local_168.m_data[3];
              auVar27 = divps(auVar28,auVar34);
              uVar21 = auVar27._0_8_;
              fVar32 = local_168.m_data[2] / local_168.m_data[3];
              fVar31 = local_168.m_data[3];
            }
            *(undefined8 *)((Vec4 *)(pfVar17 + -3))->m_data = uVar21;
            pfVar17[-1] = fVar32;
            *pfVar17 = fVar31;
          }
          pfVar17 = pfVar17 + 0x21;
        }
        executeAdvancedBlend(this,state->blendEquationAdvaced);
      }
      else {
        pfVar17 = &this->m_sampleRegister[0].blendedA;
        for (uVar15 = 0; uVar15 != 0x40; uVar15 = uVar15 + 1) {
          if (((SampleData *)(pfVar17 + -0x18))->isAlive == true) {
            iVar18 = (int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff)
                          / (long)numSamplesPerFragment) + fragNdxOffset;
            dstColor.m_data._0_8_ = *(undefined8 *)&inputFragments[iVar18].value.v;
            dstColor.m_data._8_8_ = *(undefined8 *)((long)&inputFragments[iVar18].value.v + 8);
            dstColor_1.m_data._0_8_ = &dstColor;
            dstColor_1.m_data[2] = 0.0;
            dstColor_1.m_data[3] = 1.4013e-45;
            tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_168);
            pfVar17[-1] = local_168.m_data[2];
            *(undefined8 *)((Vec3 *)(pfVar17 + -3))->m_data = local_168.m_data._0_8_;
            *pfVar17 = (float)inputFragments[iVar18].value.v.uData[3];
          }
          pfVar17 = pfVar17 + 0x21;
        }
      }
      if (TVar10 != TEXTURECHANNELCLASS_FLOATING_POINT) {
        lVar13 = 0x40;
        a = &this->m_sampleRegister[0].blendedRGB;
        while (VVar7.m_data = maxClampValue.m_data, bVar19 = lVar13 != 0, lVar13 = lVar13 + -1,
              bVar19) {
          if (((SampleData *)(a + -7))->isAlive == true) {
            dstColor.m_data[0] = minClampValue.m_data[0];
            dstColor.m_data[1] = minClampValue.m_data[1];
            dstColor.m_data[2] = minClampValue.m_data[2];
            local_168.m_data[0] = maxClampValue.m_data[0];
            local_168.m_data[1] = maxClampValue.m_data[1];
            local_168.m_data[2] = maxClampValue.m_data[2];
            maxClampValue.m_data = VVar7.m_data;
            tcu::clamp<float,3>((tcu *)&dstColor_1,a,(Vector<float,_3> *)&dstColor,
                                (Vector<float,_3> *)&local_168);
            a->m_data[2] = dstColor_1.m_data[2];
            *(undefined8 *)a->m_data = dstColor_1.m_data._0_8_;
            fVar32 = a[1].m_data[0];
            fVar31 = maxClampValue.m_data[3];
            if (fVar32 <= maxClampValue.m_data[3]) {
              fVar31 = fVar32;
            }
            *(uint *)(a + 1) =
                 -(uint)(fVar32 < minClampValue.m_data[3]) & (uint)minClampValue.m_data[3] |
                 ~-(uint)(fVar32 < minClampValue.m_data[3]) & (uint)fVar31;
          }
          a = a + 0xb;
        }
      }
      iVar18 = local_14c;
      bVar19 = (state->colorMask).m_data[1];
      if ((state->colorMask).m_data[0] == true) {
        if (((bVar19 == false) || ((state->colorMask).m_data[2] != true)) ||
           ((state->colorMask).m_data[3] != true)) {
LAB_00532f96:
          executeMaskedColorWrite
                    (this,fragNdxOffset,numSamplesPerFragment,inputFragments,&local_58,&local_68,
                     isSRGB,&local_158->m_access);
        }
        else if (((local_158->m_access).super_ConstPixelBufferAccess.m_format.order == RGBA) &&
                ((local_158->m_access).super_ConstPixelBufferAccess.m_format.type == UNORM_INT8)) {
          executeRGBA8ColorWrite
                    (this,fragNdxOffset,numSamplesPerFragment,inputFragments,&local_158->m_access);
        }
        else {
          executeColorWrite(this,fragNdxOffset,numSamplesPerFragment,inputFragments,isSRGB,
                            &local_158->m_access);
        }
      }
      else if (((bVar19 != false) || ((state->colorMask).m_data[2] != false)) ||
              ((state->colorMask).m_data[3] == true)) goto LAB_00532f96;
    }
    else {
      uVar15 = 0;
      pSVar16 = this->m_sampleRegister;
      if (cVar20 == '\x02') {
        for (; uVar15 != 0x40; uVar15 = uVar15 + 1) {
          if (((SampleData *)&pSVar16->isAlive)->isAlive == true) {
            uVar21 = *(undefined8 *)
                      ((long)&inputFragments
                              [(int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 |
                                           uVar15 & 0xffffffff) / (long)numSamplesPerFragment) +
                               fragNdxOffset].value.v + 8);
            *(undefined8 *)(pSVar16->signedValue).m_data =
                 *(undefined8 *)
                  &inputFragments
                   [(int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                         (long)numSamplesPerFragment) + fragNdxOffset].value.v;
            *(undefined8 *)((pSVar16->signedValue).m_data + 2) = uVar21;
          }
          pSVar16 = pSVar16 + 1;
        }
        if (((colorMask->m_data[0] != false) || ((state->colorMask).m_data[1] != false)) ||
           (((state->colorMask).m_data[2] != false || ((state->colorMask).m_data[3] == true)))) {
          executeSignedValueWrite
                    (this,fragNdxOffset,numSamplesPerFragment,inputFragments,colorMask,
                     &local_158->m_access);
        }
      }
      else {
        for (; uVar15 != 0x40; uVar15 = uVar15 + 1) {
          if (((SampleData *)&pSVar16->isAlive)->isAlive == true) {
            uVar21 = *(undefined8 *)
                      ((long)&inputFragments
                              [(int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 |
                                           uVar15 & 0xffffffff) / (long)numSamplesPerFragment) +
                               fragNdxOffset].value.v + 8);
            *(undefined8 *)(pSVar16->unsignedValue).m_data =
                 *(undefined8 *)
                  &inputFragments
                   [(int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                         (long)numSamplesPerFragment) + fragNdxOffset].value.v;
            *(undefined8 *)((pSVar16->unsignedValue).m_data + 2) = uVar21;
          }
          pSVar16 = pSVar16 + 1;
        }
        if ((((colorMask->m_data[0] != false) || ((state->colorMask).m_data[1] != false)) ||
            ((state->colorMask).m_data[2] != false)) || ((state->colorMask).m_data[3] == true)) {
          executeUnsignedValueWrite
                    (this,fragNdxOffset,numSamplesPerFragment,inputFragments,colorMask,
                     &local_158->m_access);
        }
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

void FragmentProcessor::render (const rr::MultisamplePixelBufferAccess&		msColorBuffer,
								const rr::MultisamplePixelBufferAccess&		msDepthBuffer,
								const rr::MultisamplePixelBufferAccess&		msStencilBuffer,
								const Fragment*								inputFragments,
								int											numFragments,
								FaceType									fragmentFacing,
								const FragmentOperationState&				state)
{
	DE_ASSERT(fragmentFacing < FACETYPE_LAST);
	DE_ASSERT(state.numStencilBits < 32); // code bitshifts numStencilBits, avoid undefined behavior

	const tcu::PixelBufferAccess&	colorBuffer			= msColorBuffer.raw();
	const tcu::PixelBufferAccess&	depthBuffer			= msDepthBuffer.raw();
	const tcu::PixelBufferAccess&	stencilBuffer		= msStencilBuffer.raw();

	bool							hasDepth			= depthBuffer.getWidth() > 0	&& depthBuffer.getHeight() > 0		&& depthBuffer.getDepth() > 0;
	bool							hasStencil			= stencilBuffer.getWidth() > 0	&& stencilBuffer.getHeight() > 0	&& stencilBuffer.getDepth() > 0;
	bool							doDepthTest			= hasDepth && state.depthTestEnabled;
	bool							doStencilTest		= hasStencil && state.stencilTestEnabled;

	tcu::TextureChannelClass		colorbufferClass	= tcu::getTextureChannelClass(msColorBuffer.raw().getFormat().type);
	rr::GenericVecType				fragmentDataType	= (colorbufferClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER) ? (rr::GENERICVECTYPE_INT32) : ((colorbufferClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER) ? (rr::GENERICVECTYPE_UINT32) : (rr::GENERICVECTYPE_FLOAT));

	DE_ASSERT((!hasDepth || colorBuffer.getWidth() == depthBuffer.getWidth())	&& (!hasStencil || colorBuffer.getWidth() == stencilBuffer.getWidth()));
	DE_ASSERT((!hasDepth || colorBuffer.getHeight() == depthBuffer.getHeight())	&& (!hasStencil || colorBuffer.getHeight() == stencilBuffer.getHeight()));
	DE_ASSERT((!hasDepth || colorBuffer.getDepth() == depthBuffer.getDepth())	&& (!hasStencil || colorBuffer.getDepth() == stencilBuffer.getDepth()));

	// Combined formats must be separated beforehand
	DE_ASSERT(!hasDepth || (!tcu::isCombinedDepthStencilType(depthBuffer.getFormat().type) && depthBuffer.getFormat().order == tcu::TextureFormat::D));
	DE_ASSERT(!hasStencil || (!tcu::isCombinedDepthStencilType(stencilBuffer.getFormat().type) && stencilBuffer.getFormat().order == tcu::TextureFormat::S));

	int						numSamplesPerFragment		= colorBuffer.getWidth();
	int						totalNumSamples				= numFragments*numSamplesPerFragment;
	int						numSampleGroups				= (totalNumSamples - 1) / SAMPLE_REGISTER_SIZE + 1; // \note totalNumSamples/SAMPLE_REGISTER_SIZE rounded up.
	const StencilState&		stencilState				= state.stencilStates[fragmentFacing];
	Vec4					colorMaskFactor				(state.colorMask[0] ? 1.0f : 0.0f, state.colorMask[1] ? 1.0f : 0.0f, state.colorMask[2] ? 1.0f : 0.0f, state.colorMask[3] ? 1.0f : 0.0f);
	Vec4					colorMaskNegationFactor		(state.colorMask[0] ? 0.0f : 1.0f, state.colorMask[1] ? 0.0f : 1.0f, state.colorMask[2] ? 0.0f : 1.0f, state.colorMask[3] ? 0.0f : 1.0f);
	bool					sRGBTarget					= state.sRGBEnabled && tcu::isSRGB(colorBuffer.getFormat());

	DE_ASSERT(SAMPLE_REGISTER_SIZE % numSamplesPerFragment == 0);

	// Divide the fragments' samples into groups of size SAMPLE_REGISTER_SIZE, and perform
	// the per-sample operations for one group at a time.

	for (int sampleGroupNdx = 0; sampleGroupNdx < numSampleGroups; sampleGroupNdx++)
	{
		// The index of the fragment of the sample at the beginning of m_sampleRegisters.
		int groupFirstFragNdx = (sampleGroupNdx*SAMPLE_REGISTER_SIZE) / numSamplesPerFragment;

		// Initialize sample data in the sample register.

		for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
		{
			int fragNdx			= groupFirstFragNdx + regSampleNdx/numSamplesPerFragment;
			int fragSampleNdx	= regSampleNdx % numSamplesPerFragment;

			if (fragNdx < numFragments)
			{
				m_sampleRegister[regSampleNdx].isAlive		= (inputFragments[fragNdx].coverage & (1u << fragSampleNdx)) != 0;
				m_sampleRegister[regSampleNdx].depthPassed	= true; // \note This will stay true if depth test is disabled.
			}
			else
				m_sampleRegister[regSampleNdx].isAlive = false;
		}

		// Scissor test.

		if (state.scissorTestEnabled)
			executeScissorTest(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.scissorRectangle);

		// Stencil test.

		if (doStencilTest)
		{
			executeStencilCompare(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);
			executeStencilSFail(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);
		}

		// Depth test.
		// \note Current value of isAlive is needed for dpPass and dpFail, so it's only updated after them and not right after depth test.

		if (doDepthTest)
		{
			executeDepthCompare(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.depthFunc, depthBuffer);

			if (state.depthMask)
				executeDepthWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, depthBuffer);
		}

		// Do dpFail and dpPass stencil writes.

		if (doStencilTest)
			executeStencilDpFailAndPass(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);

		// Kill the samples that failed depth test.

		if (doDepthTest)
		{
			for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				m_sampleRegister[regSampleNdx].isAlive = m_sampleRegister[regSampleNdx].isAlive && m_sampleRegister[regSampleNdx].depthPassed;
		}

		// Paint fragments to target

		switch (fragmentDataType)
		{
			case rr::GENERICVECTYPE_FLOAT:
			{
				// Select min/max clamping values for blending factors and operands
				Vec4 minClampValue;
				Vec4 maxClampValue;

				if (colorbufferClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
				{
					minClampValue = Vec4(0.0f);
					maxClampValue = Vec4(1.0f);
				}
				else if (colorbufferClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)
				{
					minClampValue = Vec4(-1.0f);
					maxClampValue = Vec4(1.0f);
				}
				else
				{
					// No clamping
					minClampValue = Vec4(-std::numeric_limits<float>::infinity());
					maxClampValue = Vec4(std::numeric_limits<float>::infinity());
				}

				// Blend calculation - only if using blend.
				if (state.blendMode == BLENDMODE_STANDARD)
				{
					// Put dst color to register, doing srgb-to-linear conversion if needed.
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
							const Fragment&		frag			= inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];
							Vec4				dstColor		= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

							m_sampleRegister[regSampleNdx].clampedBlendSrcColor		= clamp(frag.value.get<float>(), minClampValue, maxClampValue);
							m_sampleRegister[regSampleNdx].clampedBlendSrc1Color	= clamp(frag.value1.get<float>(), minClampValue, maxClampValue);
							m_sampleRegister[regSampleNdx].clampedBlendDstColor		= clamp(sRGBTarget ? tcu::sRGBToLinear(dstColor) : dstColor, minClampValue, maxClampValue);
						}
					}

					// Calculate blend factors to register.
					executeBlendFactorComputeRGB(state.blendColor, state.blendRGBState);
					executeBlendFactorComputeA(state.blendColor, state.blendAState);

					// Compute blended color.
					executeBlend(state.blendRGBState, state.blendAState);
				}
				else if (state.blendMode == BLENDMODE_ADVANCED)
				{
					// Unpremultiply colors for blending, and do sRGB->linear if necessary
					// \todo [2014-03-17 pyry] Re-consider clampedBlend*Color var names
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
							const Fragment&		frag			= inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];
							const Vec4			srcColor		= frag.value.get<float>();
							const Vec4			dstColor		= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

							m_sampleRegister[regSampleNdx].clampedBlendSrcColor		= unpremultiply(clamp(srcColor, minClampValue, maxClampValue));
							m_sampleRegister[regSampleNdx].clampedBlendDstColor		= unpremultiply(clamp(sRGBTarget ? tcu::sRGBToLinear(dstColor) : dstColor, minClampValue, maxClampValue));
						}
					}

					executeAdvancedBlend(state.blendEquationAdvaced);
				}
				else
				{
					// Not using blend - just put values to register as-is.
					DE_ASSERT(state.blendMode == BLENDMODE_NONE);

					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

							m_sampleRegister[regSampleNdx].blendedRGB	= frag.value.get<float>().xyz();
							m_sampleRegister[regSampleNdx].blendedA		= frag.value.get<float>().w();
						}
					}
				}

				// Clamp result values in sample register
				if (colorbufferClass != tcu::TEXTURECHANNELCLASS_FLOATING_POINT)
				{
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							m_sampleRegister[regSampleNdx].blendedRGB	= clamp(m_sampleRegister[regSampleNdx].blendedRGB, minClampValue.swizzle(0, 1, 2), maxClampValue.swizzle(0, 1, 2));
							m_sampleRegister[regSampleNdx].blendedA		= clamp(m_sampleRegister[regSampleNdx].blendedA, minClampValue.w(), maxClampValue.w());
						}
					}
				}

				// Finally, write the colors to the color buffer.

				if (state.colorMask[0] && state.colorMask[1] && state.colorMask[2] && state.colorMask[3])
				{
					if (colorBuffer.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8))
						executeRGBA8ColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, colorBuffer);
					else
						executeColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, sRGBTarget, colorBuffer);
				}
				else if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeMaskedColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, colorMaskFactor, colorMaskNegationFactor, sRGBTarget, colorBuffer);
				break;
			}
			case rr::GENERICVECTYPE_INT32:
				// Write fragments
				for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				{
					if (m_sampleRegister[regSampleNdx].isAlive)
					{
						const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

						m_sampleRegister[regSampleNdx].signedValue = frag.value.get<deInt32>();
					}
				}

				if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeSignedValueWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.colorMask, colorBuffer);
				break;

			case rr::GENERICVECTYPE_UINT32:
				// Write fragments
				for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				{
					if (m_sampleRegister[regSampleNdx].isAlive)
					{
						const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

						m_sampleRegister[regSampleNdx].unsignedValue = frag.value.get<deUint32>();
					}
				}

				if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeUnsignedValueWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.colorMask, colorBuffer);
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}